

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l5_full.c
# Opt level: O2

int picnic_l5_full_sign(picnic_l5_full_privatekey_t *sk,uint8_t *message,size_t message_len,
                       uint8_t *signature,size_t *signature_len)

{
  int iVar1;
  picnic_instance_t *pp;
  picnic_context_t context;
  picnic_context_t local_e0;
  
  iVar1 = -1;
  if (signature_len != (size_t *)0x0 &&
      (signature != (uint8_t *)0x0 && sk != (picnic_l5_full_privatekey_t *)0x0)) {
    pp = picnic_instance_get(Picnic_L5_full);
    if (pp != (picnic_instance_t *)0x0) {
      mzd_from_char_array(local_e0.m_plaintext,sk->data + 0x40,0x20);
      mzd_from_char_array(local_e0.m_key,sk->data,0x20);
      local_e0.unruh = false;
      local_e0.plaintext = sk->data + 0x40;
      local_e0.private_key = sk->data;
      local_e0.public_key = sk->data + 0x20;
      local_e0.msg = message;
      local_e0.msglen = message_len;
      iVar1 = picnic_impl_sign(pp,&local_e0,signature,signature_len);
      explicit_bzero(local_e0.m_key,0x20);
    }
  }
  return iVar1;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l5_full_sign(const picnic_l5_full_privatekey_t* sk,
                                                const uint8_t* message, size_t message_len,
                                                uint8_t* signature, size_t* signature_len) {
  if (!sk || !signature || !signature_len) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* sk_pt = SK_PT(sk);

  picnic_context_t context;
  mzd_from_char_array(context.m_plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(context.m_key, sk_sk, LOWMC_BLOCK_SZ);
  context.plaintext   = sk_pt;
  context.private_key = sk_sk;
  context.public_key  = sk_c;
  context.msg         = message;
  context.msglen      = message_len;
#if defined(WITH_UNRUH)
  context.unruh = (PARAM == Picnic_L1_UR || PARAM == Picnic_L3_UR || PARAM == Picnic_L5_UR);
#endif
  int ret = picnic_impl_sign(instance, &context, signature, signature_len);
  picnic_explicit_bzero(context.m_key, sizeof(context.m_key));
  return ret;
}